

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O2

Node * __thiscall ScapeGoatTree::buildBalanced(ScapeGoatTree *this,Node **a,int i,int ns)

{
  uint ns_00;
  Node *pNVar1;
  int iVar2;
  
  if (ns != 0) {
    ns_00 = ns / 2;
    pNVar1 = buildBalanced(this,a,i,ns_00);
    iVar2 = i + ns_00;
    a[iVar2]->leftChild = pNVar1;
    pNVar1 = a[iVar2]->leftChild;
    if (pNVar1 != (Node *)0x0) {
      pNVar1->parent = a[iVar2];
    }
    pNVar1 = buildBalanced(this,a,iVar2 + 1,~ns_00 + ns);
    a[iVar2]->rightChild = pNVar1;
    pNVar1 = a[iVar2];
    if (pNVar1->rightChild != (Node *)0x0) {
      pNVar1->rightChild->parent = pNVar1;
      pNVar1 = a[iVar2];
    }
    return pNVar1;
  }
  return (Node *)0x0;
}

Assistant:

ScapeGoatTree::Node *ScapeGoatTree::buildBalanced(Node **a, int i, int ns) {
    if (ns == 0) {
        return nullptr;
    }
    int m = ns / 2;
    a[i + m]->leftChild = buildBalanced(a, i, m);
    if (a[i + m]->leftChild != nullptr) {
        a[i + m]->leftChild->parent = a[i + m];
    }
    a[i + m]->rightChild = buildBalanced(a, i + m + 1, ns - m - 1);
    if (a[i + m]->rightChild != nullptr) {
        a[i + m]->rightChild->parent = a[i + m];
    }
    return a[i + m];
}